

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-trace.cpp
# Opt level: O2

void __thiscall testDebugTrace::test_method(testDebugTrace *this)

{
  string *psVar1;
  long lVar2;
  CustomEntity *this_00;
  istream *piVar3;
  string astr;
  string asubstr2;
  string str_to_test;
  shared_count sStack_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  fstream the_debug_file;
  output_test_stream output;
  ostringstream oss_debug_file;
  
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_548,0x3c);
  _the_debug_file = &PTR__lazy_ostream_00109c20;
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
  ;
  local_560 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
            (&the_debug_file,&local_568,0x3c,1,2,dynamicgraph::CustomEntity::CLASS_NAME_abi_cxx11_,
             "dynamicgraph::CustomEntity::CLASS_NAME","CustomEntity","\"CustomEntity\"");
  psVar1 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&the_debug_file,"CustomEntity",(allocator<char> *)&oss_debug_file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"my-entity",(allocator<char> *)&astr);
  lVar2 = dynamicgraph::FactoryStorage::newEntity(psVar1,(string *)&the_debug_file);
  if (lVar2 == 0) {
    this_00 = (CustomEntity *)0x0;
  }
  else {
    this_00 = (CustomEntity *)
              __dynamic_cast(lVar2,&dynamicgraph::Entity::typeinfo,
                             &dynamicgraph::CustomEntity::typeinfo,0);
  }
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&the_debug_file);
  dynamicgraph::CustomEntity::testDebugTrace(this_00);
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(&output,&local_578,1);
  std::fstream::fstream(&the_debug_file);
  std::fstream::open((char *)&the_debug_file,
                     (_Ios_Openmode)dynamicgraph::DebugTrace::DEBUG_FILENAME_DEFAULT);
  astr._M_dataplus._M_p = (pointer)&astr.field_2;
  astr._M_string_length = 0;
  astr.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_debug_file);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&the_debug_file,(string *)&astr);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::find((char *)&astr,0x10719a);
    std::__cxx11::string::substr((ulong)&str_to_test,(ulong)&astr);
    std::__cxx11::string::find((char *)&str_to_test,0x10719a);
    std::__cxx11::string::substr((ulong)&asubstr2,(ulong)&str_to_test);
    std::operator<<((ostream *)&oss_debug_file,(string *)&asubstr2);
    std::__cxx11::string::~string((string *)&asubstr2);
    std::__cxx11::string::~string((string *)&str_to_test);
  }
  std::fstream::close();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str_to_test,"# In {# In/Out { }Here is a test# Out }",
             (allocator<char> *)&asubstr2);
  std::__cxx11::stringbuf::str();
  std::operator==(&str_to_test,&asubstr2);
  std::__cxx11::string::~string((string *)&asubstr2);
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_588,0x65);
  sStack_5c0.pi_ = (sp_counted_base *)0x0;
  asubstr2.field_2._8_8_ = &local_5a8;
  local_5a8 = "two_sub_string_identical";
  local_5a0 = "";
  asubstr2._M_string_length._0_1_ = 0;
  asubstr2._M_dataplus._M_p = "\x0eg\x10";
  asubstr2.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
  ;
  local_5b0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_5c0);
  (**(code **)(*(long *)this_00 + 8))();
  std::__cxx11::string::~string((string *)&str_to_test);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_debug_file);
  std::__cxx11::string::~string((string *)&astr);
  std::fstream::~fstream(&the_debug_file);
  boost::test_tools::output_test_stream::~output_test_stream(&output);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(testDebugTrace) {
  BOOST_CHECK_EQUAL(dynamicgraph::CustomEntity::CLASS_NAME, "CustomEntity");

  dynamicgraph::CustomEntity *ptr_entity =
      (dynamic_cast<dynamicgraph::CustomEntity *>(
          dynamicgraph::FactoryStorage::getInstance()->newEntity("CustomEntity",

                                                                 "my-entity")));

  dynamicgraph::CustomEntity &entity = *ptr_entity;
  entity.testDebugTrace();

  /// Copy the debug file into the oss_debug_file
  output_test_stream output;
  std::fstream the_debug_file;
  the_debug_file.open(dynamicgraph::DebugTrace::DEBUG_FILENAME_DEFAULT,
                      std::ios::in);

  // Extract the filename and this source file from the output
  std::string astr;
  std::ostringstream oss_debug_file;
  while (std::getline(the_debug_file, astr)) {
    std::size_t found = astr.find(":");
    std::string asubstr = astr.substr(found + 1, astr.length());
    found = asubstr.find(":");
    std::string asubstr2 = asubstr.substr(found + 1, astr.length());
    oss_debug_file << asubstr2;
  }

  the_debug_file.close();

  // Compare with the strings put inside this source file
  std::string str_to_test =
      "# In {"
      "# In/Out { }"
      "Here is a test"
      "# Out }";
  bool two_sub_string_identical;

  // Make comparisons.
  two_sub_string_identical = str_to_test == oss_debug_file.str();

  BOOST_CHECK(two_sub_string_identical);

  delete ptr_entity;
}